

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCore.c
# Opt level: O0

int Sbd_ManFindCands(Sbd_Man_t *p,word *Cover,int nDivs)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  word Target;
  int c3;
  int c2;
  int c1;
  int c0;
  int Limits [4];
  int Order [64];
  int Ones [64];
  int nDivs_local;
  word *Cover_local;
  Sbd_Man_t *p_local;
  
  iVar2 = nDivs / 4 + 1;
  iVar3 = nDivs / 3 + 2;
  Limits[0] = nDivs / 2 + 3;
  uVar1 = Cover[nDivs];
  Limits[1] = nDivs;
  if ((nDivs < 8) || (p->pPars->fCover != 0)) {
    p_local._4_4_ = Sbd_ManFindCandsSimple(p,Cover,nDivs);
  }
  else {
    Vec_IntClear(p->vDivSet);
    for (c2 = 0; c2 < nDivs; c2 = c2 + 1) {
      if (Cover[c2] == uVar1) {
        Vec_IntPush(p->vDivSet,c2);
        return 1;
      }
    }
    for (c2 = 0; c3 = c2, c2 < nDivs; c2 = c2 + 1) {
      while (c3 = c3 + 1, c3 < nDivs) {
        if ((Cover[c2] | Cover[c3]) == uVar1) {
          Vec_IntPush(p->vDivSet,c2);
          Vec_IntPush(p->vDivSet,c3);
          return 1;
        }
      }
    }
    for (c2 = 0; c2 < nDivs; c2 = c2 + 1) {
      iVar4 = Abc_TtCountOnes(Cover[c2]);
      Order[(long)c2 + 0x3e] = iVar4;
    }
    for (c2 = 0; c2 < nDivs; c2 = c2 + 1) {
      Limits[(long)c2 + 2] = c2;
    }
    Vec_IntSelectSortCost2Reverse(Limits + 2,nDivs,Order + 0x3e);
    for (c2 = 0; iVar4 = c2, c2 < iVar2; c2 = c2 + 1) {
      while (c3 = iVar4 + 1, c3 < iVar3) {
        for (Target._4_4_ = iVar4 + 2; iVar4 = c3, Target._4_4_ < Limits[0];
            Target._4_4_ = Target._4_4_ + 1) {
          if ((Cover[Limits[(long)c2 + 2]] | Cover[Limits[(long)c3 + 2]] |
              Cover[Limits[(long)Target._4_4_ + 2]]) == uVar1) {
            Vec_IntPush(p->vDivSet,Limits[(long)c2 + 2]);
            Vec_IntPush(p->vDivSet,Limits[(long)c3 + 2]);
            Vec_IntPush(p->vDivSet,Limits[(long)Target._4_4_ + 2]);
            return 1;
          }
        }
      }
    }
    for (c2 = 0; iVar4 = c2, c2 < iVar2; c2 = c2 + 1) {
      while (c3 = iVar4 + 1, c3 < iVar3) {
        for (Target._4_4_ = iVar4 + 2; iVar4 = c3, Target._0_4_ = Target._4_4_,
            Target._4_4_ < Limits[0]; Target._4_4_ = Target._4_4_ + 1) {
          while (Target._0_4_ = (int)Target + 1, (int)Target < Limits[1]) {
            if ((Cover[Limits[(long)c2 + 2]] | Cover[Limits[(long)c3 + 2]] |
                 Cover[Limits[(long)Target._4_4_ + 2]] | Cover[Limits[(long)(int)Target + 2]]) ==
                uVar1) {
              Vec_IntPush(p->vDivSet,Limits[(long)c2 + 2]);
              Vec_IntPush(p->vDivSet,Limits[(long)c3 + 2]);
              Vec_IntPush(p->vDivSet,Limits[(long)Target._4_4_ + 2]);
              Vec_IntPush(p->vDivSet,Limits[(long)(int)Target + 2]);
              return 1;
            }
          }
        }
      }
    }
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

static inline int Sbd_ManFindCands( Sbd_Man_t * p, word Cover[64], int nDivs )
{
    int Ones[64], Order[64];
    int Limits[4] = { nDivs/4+1, nDivs/3+2, nDivs/2+3, nDivs };
    int c0, c1, c2, c3;
    word Target = Cover[nDivs];

    if ( nDivs < 8 || p->pPars->fCover )
        return Sbd_ManFindCandsSimple( p, Cover, nDivs );

    Vec_IntClear( p->vDivSet );
    for ( c0 = 0; c0 < nDivs; c0++ )
        if ( Cover[c0] == Target )
        {
            Vec_IntPush( p->vDivSet, c0 );
            return 1;
        }

    for ( c0 = 0;    c0 < nDivs; c0++ )
    for ( c1 = c0+1; c1 < nDivs; c1++ )
        if ( (Cover[c0] | Cover[c1]) == Target )
        {
            Vec_IntPush( p->vDivSet, c0 );
            Vec_IntPush( p->vDivSet, c1 );
            return 1;
        }

    // count ones
    for ( c0 = 0; c0 < nDivs; c0++ )
        Ones[c0] = Abc_TtCountOnes( Cover[c0] );

    // sort by the number of ones
    for ( c0 = 0; c0 < nDivs; c0++ )
        Order[c0] = c0;
    Vec_IntSelectSortCost2Reverse( Order, nDivs, Ones );

    // sort with limits
    for ( c0 = 0;    c0 < Limits[0]; c0++ )
    for ( c1 = c0+1; c1 < Limits[1]; c1++ )
    for ( c2 = c1+1; c2 < Limits[2]; c2++ )
        if ( (Cover[Order[c0]] | Cover[Order[c1]] | Cover[Order[c2]]) == Target )
        {
            Vec_IntPush( p->vDivSet, Order[c0] );
            Vec_IntPush( p->vDivSet, Order[c1] );
            Vec_IntPush( p->vDivSet, Order[c2] );
            return 1;
        }

    for ( c0 = 0;    c0 < Limits[0]; c0++ )
    for ( c1 = c0+1; c1 < Limits[1]; c1++ )
    for ( c2 = c1+1; c2 < Limits[2]; c2++ )
    for ( c3 = c2+1; c3 < Limits[3]; c3++ )
    {
        if ( (Cover[Order[c0]] | Cover[Order[c1]] | Cover[Order[c2]] | Cover[Order[c3]]) == Target )
        {
            Vec_IntPush( p->vDivSet, Order[c0] );
            Vec_IntPush( p->vDivSet, Order[c1] );
            Vec_IntPush( p->vDivSet, Order[c2] );
            Vec_IntPush( p->vDivSet, Order[c3] );
            return 1;
        }
    }
    return 0;
}